

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_iarchive.h
# Opt level: O0

bool __thiscall serialization::xml_iarchive::load_key_start_optional(xml_iarchive *this,char *key)

{
  reference ppxVar1;
  bool bVar2;
  xml_node<char> *local_30;
  xml_node<char> *node;
  char *pcStack_20;
  serialization_trace trace;
  char *key_local;
  xml_iarchive *this_local;
  
  pcStack_20 = key;
  serialization_trace::serialization_trace<char_const(&)[24],char_const*&>
            ((serialization_trace *)((long)&node + 7),(char (*) [24])"load_key_start_optional",
             &stack0xffffffffffffffe0);
  ppxVar1 = std::
            stack<const_rapidxml::xml_node<char>_*,_std::deque<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>_>
            ::top(&this->stack_);
  local_30 = rapidxml::xml_node<char>::first_node(*ppxVar1,pcStack_20,0,true);
  bVar2 = local_30 != (xml_node<char> *)0x0;
  if (bVar2) {
    std::
    stack<const_rapidxml::xml_node<char>_*,_std::deque<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>_>
    ::push(&this->stack_,&local_30);
  }
  return bVar2;
}

Assistant:

bool load_key_start_optional(const char * key) const
    {
        serialization_trace trace(__func__, key);

        auto node = stack_.top()->first_node(key);
        if(node == nullptr)
        {
            return false;
        }
        stack_.push(node);
        return true;
    }